

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  char *pcVar1;
  char *pcVar2;
  undefined3 in_register_00000089;
  bool bVar3;
  
  pcVar2 = "}\n";
  bVar3 = CONCAT31(in_register_00000089,single_line_mode) != 0;
  if (bVar3) {
    pcVar2 = "} ";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = "";
  if (bVar3) {
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintMessageEnd(
    const Message& message,
    int field_index,
    int field_count,
    bool single_line_mode) const {
  return single_line_mode ? "} " : "}\n";
}